

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O3

PyObject * libxml_xmlFirstElementChild(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlNodePtr node;
  PyObject *pPVar2;
  undefined8 uVar3;
  PyObject *pyobj_parent;
  undefined *local_10;
  
  pPVar2 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:xmlFirstElementChild",&local_10);
  if (iVar1 != 0) {
    if (local_10 == &_Py_NoneStruct) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(undefined8 *)(local_10 + 0x10);
    }
    node = (xmlNodePtr)xmlFirstElementChild(uVar3);
    pPVar2 = libxml_xmlNodePtrWrap(node);
  }
  return pPVar2;
}

Assistant:

XML_POP_WARNINGS

PyObject *
libxml_xmlFirstElementChild(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlNodePtr c_retval;
    xmlNodePtr parent;
    PyObject *pyobj_parent;

    if (!PyArg_ParseTuple(args, (char *)"O:xmlFirstElementChild", &pyobj_parent))
        return(NULL);
    parent = (xmlNodePtr) PyxmlNode_Get(pyobj_parent);

    c_retval = xmlFirstElementChild(parent);
    py_retval = libxml_xmlNodePtrWrap((xmlNodePtr) c_retval);
    return(py_retval);
}